

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpressionGenerator.cpp
# Opt level: O2

Expression * __thiscall
rsg::ExpressionGenerator::generate
          (ExpressionGenerator *this,ValueRange *valueRange,int initialDepth)

{
  GeneratorState *state;
  ConstValueRangeAccess valueRange_00;
  Scalar *pSVar1;
  Expression *root;
  Scalar *pSVar2;
  
  state = this->m_state;
  state->m_expressionDepth = initialDepth;
  pSVar1 = (valueRange->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2 = (valueRange->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar1 == (valueRange->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pSVar1 = (Scalar *)0x0;
  }
  if (pSVar2 == (valueRange->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pSVar2 = (Scalar *)0x0;
  }
  valueRange_00.m_min = pSVar1;
  valueRange_00.m_type = &valueRange->m_type;
  valueRange_00.m_max = pSVar2;
  root = Expression::createRandom(state,valueRange_00);
  generate(this,root);
  return root;
}

Assistant:

Expression* ExpressionGenerator::generate (const ValueRange& valueRange, int initialDepth)
{
	// Create root
	m_state.setExpressionDepth(initialDepth);
	Expression* root = Expression::createRandom(m_state, valueRange);

	try
	{
		// Generate full expression
		generate(root);
	}
	catch (const std::exception&)
	{
		delete root;
		m_expressionStack.clear();
		throw;
	}

	return root;
}